

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  uint8 *puVar1;
  size_t __n;
  
  puVar1 = this->end_ + (0x10 - (long)ptr);
  if ((int)puVar1 < size) {
    do {
      size = size - (int)puVar1;
      __n = (size_t)(int)puVar1;
      memcpy(ptr,data,__n);
      data = (void *)((long)data + __n);
      ptr = EnsureSpaceFallback(this,ptr + __n);
      puVar1 = this->end_ + (0x10 - (long)ptr);
    } while ((int)puVar1 < size);
  }
  memcpy(ptr,data,(long)size);
  return ptr + size;
}

Assistant:

uint8* EpsCopyOutputStream::WriteRawFallback(const void* data, int size,
                                             uint8* ptr) {
  int s = GetSize(ptr);
  while (s < size) {
    std::memcpy(ptr, data, s);
    size -= s;
    data = static_cast<const uint8*>(data) + s;
    ptr = EnsureSpaceFallback(ptr + s);
    s = GetSize(ptr);
  }
  std::memcpy(ptr, data, size);
  return ptr + size;
}